

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *coScaleval,
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *scaleval,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *epsilon)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  long lVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  fpclass_type fVar7;
  int iVar8;
  double *pdVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar11;
  long lVar12;
  long *plVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  cpp_dec_float<50U,_int,_void> local_248;
  cpp_dec_float<50U,_int,_void> *local_210;
  cpp_dec_float<50U,_int,_void> local_208;
  cpp_dec_float<50U,_int,_void> local_1c8;
  undefined1 local_188 [16];
  uint local_178 [3];
  undefined3 uStack_16b;
  uint local_168 [3];
  bool local_15c;
  undefined8 local_158;
  double local_150;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_108;
  soplex *local_c8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_c0;
  long local_b8;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  pointer local_68;
  pointer pnStack_60;
  pointer local_58;
  pointer pnStack_50;
  pointer local_48;
  int local_40;
  bool local_3c;
  pointer local_38;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  pcVar1 = &__return_storage_ptr__->m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined1 (*) [16])((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) =
       (undefined1  [16])0x0;
  local_210 = &__return_storage_ptr__->m_backend;
  local_c0 = coScaleval;
  local_b0 = vecset;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,0.0);
  if (0 < *(int *)(this + 0x38)) {
    pdVar9 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_150 = *pdVar9;
    local_b8 = 0;
    local_c8 = this;
    do {
      plVar13 = (long *)((long)*(int *)(*(long *)(local_c8 + 0x28) + 4 + local_b8 * 8) * 0x28 +
                        *(long *)(local_c8 + 0x20));
      local_108.fpclass = cpp_dec_float_finite;
      local_108.prec_elem = 10;
      local_108.data._M_elems[0] = 0;
      local_108.data._M_elems[1] = 0;
      local_108.data._M_elems[2] = 0;
      local_108.data._M_elems[3] = 0;
      local_108.data._M_elems[4] = 0;
      local_108.data._M_elems[5] = 0;
      local_108.data._M_elems._24_5_ = 0;
      local_108.data._M_elems[7]._1_3_ = 0;
      local_108.data._M_elems[8] = 0;
      local_108.data._M_elems[9] = 0;
      local_108.exp = 0;
      local_108.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_108,0.0);
      ::soplex::infinity::__tls_init();
      local_1c8.fpclass = cpp_dec_float_finite;
      local_1c8.prec_elem = 10;
      local_1c8.data._M_elems[0] = 0;
      local_1c8.data._M_elems[1] = 0;
      local_1c8.data._M_elems[2] = 0;
      local_1c8.data._M_elems[3] = 0;
      local_1c8.data._M_elems[4] = 0;
      local_1c8.data._M_elems[5] = 0;
      local_1c8.data._M_elems._24_5_ = 0;
      local_1c8.data._M_elems[7]._1_3_ = 0;
      local_1c8.data._M_elems[8] = 0;
      local_1c8.data._M_elems[9] = 0;
      local_1c8.exp = 0;
      local_1c8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1c8,local_150);
      if (0 < *(int *)((long)plVar13 + 0xc)) {
        lVar12 = 0;
        lVar11 = 0;
        do {
          lVar3 = *plVar13;
          pcVar1 = (cpp_dec_float<50U,_int,_void> *)(lVar3 + lVar12);
          pcVar10 = (cpp_dec_float<50U,_int,_void> *)
                    ((local_b0->
                     super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._vptr_ClassArray + (ulong)*(uint *)(lVar3 + 0x38 + lVar12) * 7);
          local_158._0_4_ = cpp_dec_float_finite;
          local_158._4_4_ = 10;
          local_188 = (undefined1  [16])0x0;
          local_178[0] = 0;
          local_178[1] = 0;
          stack0xfffffffffffffe90 = 0;
          uStack_16b = 0;
          local_168[0] = 0;
          local_168[1] = 0;
          local_168[2] = 0;
          local_15c = false;
          v = pcVar1;
          if (((cpp_dec_float<50U,_int,_void> *)local_188 != pcVar10) &&
             (v = pcVar10, pcVar1 != (cpp_dec_float<50U,_int,_void> *)local_188)) {
            local_168._0_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_188 = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
            local_178._0_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            uVar5 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            stack0xfffffffffffffe90 = (undefined5)uVar5;
            uStack_16b = (undefined3)((ulong)uVar5 >> 0x28);
            local_168[2] = *(int *)(lVar3 + 0x28 + lVar12);
            local_15c = *(bool *)(lVar3 + 0x2c + lVar12);
            local_158 = *(undefined8 *)(lVar3 + 0x30 + lVar12);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_188,v);
          local_248.data._M_elems._32_5_ = SUB85(local_168._0_8_,0);
          local_248.data._M_elems[9]._1_3_ = SUB83(local_168._0_8_,5);
          local_248.data._M_elems[4] = local_178[0];
          local_248.data._M_elems[5] = local_178[1];
          local_248.data._M_elems._24_5_ = stack0xfffffffffffffe90;
          local_248.data._M_elems[7]._1_3_ = uStack_16b;
          local_248.data._M_elems[0] = local_188._0_4_;
          local_248.data._M_elems[1] = local_188._4_4_;
          local_248.data._M_elems[2] = local_188._8_4_;
          local_248.data._M_elems[3] = local_188._12_4_;
          auVar6 = (undefined1  [16])local_248.data._M_elems._0_16_;
          local_248.exp = local_168[2];
          local_248.neg = local_15c;
          fVar7 = (fpclass_type)local_158;
          local_248.fpclass = (fpclass_type)local_158;
          local_248.prec_elem = local_158._4_4_;
          local_248.data._M_elems[0] = local_188._0_4_;
          if ((local_15c == true) &&
             (local_248.data._M_elems[0] != 0 || fVar7 != cpp_dec_float_finite)) {
            local_248.neg = false;
          }
          local_208.data._M_elems[4] = local_178[0];
          local_208.data._M_elems[5] = local_178[1];
          local_208.data._M_elems._24_5_ = stack0xfffffffffffffe90;
          local_208.data._M_elems[7]._1_3_ = uStack_16b;
          local_208.data._M_elems[0] = local_188._0_4_;
          local_208.data._M_elems[1] = local_188._4_4_;
          local_208.data._M_elems[2] = local_188._8_4_;
          local_208.data._M_elems[3] = local_188._12_4_;
          local_68 = (scaleval->
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          pnStack_60 = (scaleval->
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
          local_58 = (scaleval->
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage;
          pnStack_50 = scaleval[1].
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          local_48 = scaleval[1].
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          local_40 = *(int *)&scaleval[1].
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_3c = *(bool *)((long)&scaleval[1].
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
          local_38 = scaleval[2].
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_208.exp = local_168[2];
          local_208.neg = local_248.neg;
          local_208.fpclass = (fpclass_type)local_158;
          local_208.prec_elem = local_158._4_4_;
          if ((local_248.neg == true) &&
             (local_248.data._M_elems[0] != 0 || fVar7 != cpp_dec_float_finite)) {
            local_208.neg = false;
          }
          local_248.data._M_elems._0_16_ = auVar6;
          local_208.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
          local_208.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
          if (((int)local_38 == 2 || fVar7 == cpp_dec_float_NaN) ||
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_208,(cpp_dec_float<50U,_int,_void> *)&local_68), 0 < iVar8))
          {
            if ((local_248.fpclass != cpp_dec_float_NaN) &&
               ((local_108.fpclass != cpp_dec_float_NaN &&
                (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_248,&local_108), 0 < iVar8)))) {
              local_108.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
              local_108.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
              local_108.data._M_elems[4] = local_248.data._M_elems[4];
              local_108.data._M_elems[5] = local_248.data._M_elems[5];
              local_108.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
              local_108.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
              local_108.data._M_elems[0] = local_248.data._M_elems[0];
              local_108.data._M_elems[1] = local_248.data._M_elems[1];
              local_108.data._M_elems[2] = local_248.data._M_elems[2];
              local_108.data._M_elems[3] = local_248.data._M_elems[3];
              local_108.exp = local_248.exp;
              local_108.neg = local_248.neg;
              local_108.fpclass = local_248.fpclass;
              local_108.prec_elem = local_248.prec_elem;
            }
            if (((local_248.fpclass != cpp_dec_float_NaN) &&
                (local_1c8.fpclass != cpp_dec_float_NaN)) &&
               (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_248,&local_1c8), iVar8 < 0)) {
              local_1c8.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
              local_1c8.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
              local_1c8.data._M_elems[4] = local_248.data._M_elems[4];
              local_1c8.data._M_elems[5] = local_248.data._M_elems[5];
              local_1c8.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
              local_1c8.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
              local_1c8.data._M_elems[0] = local_248.data._M_elems[0];
              local_1c8.data._M_elems[1] = local_248.data._M_elems[1];
              local_1c8.data._M_elems[2] = local_248.data._M_elems[2];
              local_1c8.data._M_elems[3] = local_248.data._M_elems[3];
              local_1c8.exp = local_248.exp;
              local_1c8.neg = local_248.neg;
              local_1c8.fpclass = local_248.fpclass;
              local_1c8.prec_elem = local_248.prec_elem;
            }
          }
          lVar11 = lVar11 + 1;
          lVar12 = lVar12 + 0x3c;
        } while (lVar11 < *(int *)((long)plVar13 + 0xc));
      }
      ::soplex::infinity::__tls_init();
      local_248.fpclass = cpp_dec_float_finite;
      local_248.prec_elem = 10;
      local_248.data._M_elems[0] = 0;
      local_248.data._M_elems[1] = 0;
      local_248.data._M_elems[2] = 0;
      local_248.data._M_elems[3] = 0;
      local_248.data._M_elems[4] = 0;
      local_248.data._M_elems[5] = 0;
      local_248.data._M_elems._24_5_ = 0;
      local_248.data._M_elems[7]._1_3_ = 0;
      local_248.data._M_elems._32_5_ = 0;
      local_248.data._M_elems[9]._1_3_ = 0;
      local_248.exp = 0;
      local_248.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_248,local_150);
      if (((local_1c8.fpclass == cpp_dec_float_NaN) || (local_248.fpclass == cpp_dec_float_NaN)) ||
         (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1c8,&local_248), iVar8 != 0)) {
        if (local_108.fpclass != cpp_dec_float_NaN) {
          local_208.fpclass = cpp_dec_float_finite;
          local_208.prec_elem = 10;
          local_208.data._M_elems._0_16_ = ZEXT816(0);
          local_208.data._M_elems[4] = 0;
          local_208.data._M_elems[5] = 0;
          local_208.data._M_elems._24_5_ = 0;
          local_208.data._M_elems[7]._1_3_ = 0;
          local_208.data._M_elems._32_5_ = 0;
          local_208.data._M_elems[9]._1_3_ = 0;
          local_208.exp = 0;
          local_208.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_208,0.0);
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_108,&local_208);
          if (iVar8 == 0) goto LAB_0017ba6a;
        }
      }
      else {
LAB_0017ba6a:
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1c8,1.0);
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_108,1.0);
      }
      auVar6 = (undefined1  [16])local_1c8.data._M_elems._0_16_;
      local_148.data._M_elems[8] = local_1c8.data._M_elems[8];
      local_148.data._M_elems[9] = local_1c8.data._M_elems[9];
      local_148.data._M_elems[7]._1_3_ = local_1c8.data._M_elems[7]._1_3_;
      local_148.data._M_elems._24_5_ = local_1c8.data._M_elems._24_5_;
      local_148.data._M_elems[4] = local_1c8.data._M_elems[4];
      local_148.data._M_elems[5] = local_1c8.data._M_elems[5];
      local_148.data._M_elems[0] = local_1c8.data._M_elems[0];
      local_148.data._M_elems[1] = local_1c8.data._M_elems[1];
      local_148.data._M_elems[2] = local_1c8.data._M_elems[2];
      local_148.data._M_elems[3] = local_1c8.data._M_elems[3];
      local_148.exp = local_1c8.exp;
      local_148.neg = local_1c8.neg;
      local_148.fpclass = local_1c8.fpclass;
      local_148.prec_elem = local_1c8.prec_elem;
      local_1c8.data._M_elems._0_16_ = auVar6;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_148,&local_108);
      local_a8.data._M_elems[8] = local_148.data._M_elems[8];
      local_a8.data._M_elems[9] = local_148.data._M_elems[9];
      local_a8.data._M_elems[4] = local_148.data._M_elems[4];
      local_a8.data._M_elems[5] = local_148.data._M_elems[5];
      local_a8.data._M_elems[6] = local_148.data._M_elems[6];
      local_a8.data._M_elems[7] = local_148.data._M_elems[7];
      local_a8.data._M_elems[0] = local_148.data._M_elems[0];
      local_a8.data._M_elems[1] = local_148.data._M_elems[1];
      local_a8.data._M_elems[2] = local_148.data._M_elems[2];
      local_a8.data._M_elems[3] = local_148.data._M_elems[3];
      local_a8.exp = local_148.exp;
      local_a8.neg = local_148.neg;
      local_a8.fpclass = local_148.fpclass;
      local_a8.prec_elem = local_148.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::calculate_sqrt(&local_a8);
      local_248.fpclass = cpp_dec_float_finite;
      local_248.prec_elem = 10;
      local_248.data._M_elems._0_16_ = ZEXT816(0);
      local_248.data._M_elems[4] = 0;
      local_248.data._M_elems[5] = 0;
      local_248.data._M_elems._24_5_ = 0;
      local_248.data._M_elems[7]._1_3_ = 0;
      local_248.data._M_elems._32_5_ = 0;
      local_248.data._M_elems[9]._1_3_ = 0;
      local_248.exp = 0;
      local_248.neg = false;
      local_208.fpclass = cpp_dec_float_finite;
      local_208.prec_elem = 10;
      local_208.data._M_elems._0_16_ = ZEXT816(0);
      local_208.data._M_elems[4] = 0;
      local_208.data._M_elems[5] = 0;
      local_208.data._M_elems._24_5_ = 0;
      local_208.data._M_elems[7]._1_3_ = 0;
      local_208.data._M_elems._32_5_ = 0;
      local_208.data._M_elems[9]._1_3_ = 0;
      local_208.exp = 0;
      local_208.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_208,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_248,&local_208,&local_a8);
      lVar11 = local_b8;
      pnVar4 = (local_c0->
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)pnVar4[local_b8].m_backend.data._M_elems + 0x20) =
           CONCAT35(local_248.data._M_elems[9]._1_3_,local_248.data._M_elems._32_5_);
      puVar2 = (uint *)((long)pnVar4[local_b8].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar2 = local_248.data._M_elems._16_8_;
      *(ulong *)(puVar2 + 2) =
           CONCAT35(local_248.data._M_elems[7]._1_3_,local_248.data._M_elems._24_5_);
      *(undefined8 *)pnVar4[local_b8].m_backend.data._M_elems = local_248.data._M_elems._0_8_;
      *(undefined8 *)((long)pnVar4[local_b8].m_backend.data._M_elems + 8) =
           local_248.data._M_elems._8_8_;
      pnVar4[local_b8].m_backend.exp = local_248.exp;
      pnVar4[local_b8].m_backend.neg = local_248.neg;
      pnVar4[local_b8].m_backend.fpclass = local_248.fpclass;
      pnVar4[local_b8].m_backend.prec_elem = local_248.prec_elem;
      local_208.fpclass = cpp_dec_float_finite;
      local_208.prec_elem = 10;
      local_208.data._M_elems[0] = 0;
      local_208.data._M_elems[1] = 0;
      local_208.data._M_elems[2] = 0;
      local_208.data._M_elems[3] = 0;
      local_208.data._M_elems[4] = 0;
      local_208.data._M_elems[5] = 0;
      local_208.data._M_elems._24_5_ = 0;
      local_208.data._M_elems[7]._1_3_ = 0;
      local_208.data._M_elems._32_5_ = 0;
      local_208.data._M_elems[9]._1_3_ = 0;
      local_208.exp = 0;
      local_208.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_208,&local_108,&local_1c8);
      if (((local_208.fpclass != cpp_dec_float_NaN) && (local_210->fpclass != cpp_dec_float_NaN)) &&
         (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_208,local_210), 0 < iVar8)) {
        *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_210->data)->data)._M_elems + 8) =
             CONCAT35(local_208.data._M_elems[9]._1_3_,local_208.data._M_elems._32_5_);
        *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_210->data)->data)._M_elems + 4) =
             local_208.data._M_elems._16_8_;
        *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_210->data)->data)._M_elems + 6) =
             CONCAT35(local_208.data._M_elems[7]._1_3_,local_208.data._M_elems._24_5_);
        *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_210->data)->data)._M_elems =
             local_208.data._M_elems._0_8_;
        *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_210->data)->data)._M_elems + 2) =
             local_208.data._M_elems._8_8_;
        local_210->exp = local_208.exp;
        local_210->neg = local_208.neg;
        local_210->fpclass = local_208.fpclass;
        local_210->prec_elem = local_208.prec_elem;
      }
      local_b8 = lVar11 + 1;
    } while (local_b8 < *(int *)(local_c8 + 0x38));
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_210;
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}